

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtprandomurandom.cpp
# Opt level: O1

double __thiscall jrtplib::RTPRandomURandom::GetRandomDouble(RTPRandomURandom *this)

{
  uint64_t value;
  ulong local_10;
  
  if ((FILE *)this->device != (FILE *)0x0) {
    fread(&local_10,8,1,(FILE *)this->device);
    return (double)(local_10 & 0x7fffffffffffffff) * 1.0842021724855044e-19;
  }
  return 0.0;
}

Assistant:

double RTPRandomURandom::GetRandomDouble()
{
	if (!device)
		return 0;

	uint64_t value;

	fread(&value, sizeof(uint64_t), 1, device);

#ifdef RTP_HAVE_VSUINT64SUFFIX
	value &= 0x7fffffffffffffffui64;
#else
	value &= 0x7fffffffffffffffULL;
#endif // RTP_HAVE_VSUINT64SUFFIX

	int64_t value2 = (int64_t)value;
	double x = RTPRANDOM_2POWMIN63*(double)value2;

	return x;

}